

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVLD3DupInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  DecodeStatus DVar6;
  MCInst *in_RCX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint Rd;
  uint inc;
  uint Rm;
  uint Rn;
  DecodeStatus S;
  undefined4 in_stack_ffffffffffffffc0;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0xc,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0x16,1);
  uVar4 = uVar3 << 4 | uVar2;
  fieldFromInstruction_4(in_ESI,0x10,4);
  uVar2 = fieldFromInstruction_4(in_ESI,0,4);
  uVar3 = fieldFromInstruction_4(in_ESI,5,1);
  iVar5 = uVar3 + 1;
  DVar6 = DecodeDPRRegisterClass
                    (in_RCX,local_4,CONCAT44(uVar2,iVar5),
                     (void *)CONCAT44(uVar4,in_stack_ffffffffffffffc0));
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
  if (_Var1) {
    DVar6 = DecodeDPRRegisterClass
                      (in_RCX,local_4,CONCAT44(uVar2,iVar5),
                       (void *)CONCAT44(uVar4,in_stack_ffffffffffffffc0));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
    if (_Var1) {
      DVar6 = DecodeDPRRegisterClass
                        (in_RCX,local_4,CONCAT44(uVar2,iVar5),
                         (void *)CONCAT44(uVar4,in_stack_ffffffffffffffc0));
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
      if (_Var1) {
        if (uVar2 != 0xf) {
          DVar6 = DecodeGPRRegisterClass
                            (in_RCX,local_4,CONCAT44(uVar2,iVar5),
                             (void *)CONCAT44(uVar4,in_stack_ffffffffffffffc0));
          _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
          if (!_Var1) {
            return MCDisassembler_Fail;
          }
        }
        DVar6 = DecodeGPRRegisterClass
                          (in_RCX,local_4,CONCAT44(uVar2,iVar5),
                           (void *)CONCAT44(uVar4,in_stack_ffffffffffffffc0));
        _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
        if (_Var1) {
          MCOperand_CreateImm0(in_RDI,0);
          if (uVar2 == 0xd) {
            MCOperand_CreateReg0(in_RDI,0);
          }
          else if (uVar2 != 0xf) {
            DVar6 = DecodeGPRRegisterClass
                              (in_RCX,local_4,CONCAT44(uVar2,iVar5),
                               (void *)CONCAT44(uVar4,in_stack_ffffffffffffffc0));
            _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
            if (!_Var1) {
              local_4 = MCDisassembler_Fail;
            }
          }
        }
        else {
          local_4 = MCDisassembler_Fail;
        }
      }
      else {
        local_4 = MCDisassembler_Fail;
      }
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeVLD3DupInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rn, Rm, inc;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	inc = fieldFromInstruction_4(Insn, 5, 1) + 1;

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+inc)%32, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2*inc)%32, Address, Decoder)))
		return MCDisassembler_Fail;
	if (Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, 0);

	if (Rm == 0xD)
		MCOperand_CreateReg0(Inst, 0);
	else if (Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}